

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListGraph.c
# Opt level: O2

void DFSTraverse(LGraph G)

{
  ulong uVar1;
  long lVar2;
  LGraph *pLVar3;
  undefined8 *puVar4;
  ulong uVar5;
  byte bVar6;
  undefined8 auStack_808 [202];
  int visited [100];
  
  bVar6 = 0;
  uVar1 = 0;
  uVar5 = (ulong)(uint)G.vexnum;
  if (G.vexnum < 1) {
    uVar5 = uVar1;
  }
  for (; uVar5 != uVar1; uVar1 = uVar1 + 1) {
    visited[uVar1] = 0;
  }
  printf("DFS: ");
  for (uVar1 = 0; uVar5 != uVar1; uVar1 = uVar1 + 1) {
    if (visited[uVar1] == 0) {
      pLVar3 = &G;
      puVar4 = auStack_808;
      for (lVar2 = 0xc9; lVar2 != 0; lVar2 = lVar2 + -1) {
        *puVar4 = *(undefined8 *)pLVar3;
        pLVar3 = (LGraph *)((long)pLVar3 + (ulong)bVar6 * -0x10 + 8);
        puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
      }
      DFS(uVar1 & 0xffffffff,visited);
    }
  }
  putchar(10);
  return;
}

Assistant:

void DFSTraverse(LGraph G)
{
    int i;
    int visited[MAX];       // 顶点访问标记

    // 初始化所有顶点都没有被访问
    for (i = 0; i < G.vexnum; i++)
        visited[i] = 0;

    printf("DFS: ");
    for (i = 0; i < G.vexnum; i++)
    {
        if (!visited[i])
            DFS(G, i, visited);
    }
    printf("\n");
}